

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O2

char * pathcat(char *prefix,char *path)

{
  size_t sVar1;
  size_t sVar2;
  char *__dest;
  int *piVar3;
  
  if (prefix == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(prefix);
    sVar1 = sVar1 + 1;
  }
  sVar2 = strlen(path);
  __dest = (char *)malloc(sVar2 + sVar1 + 1);
  if (__dest != (char *)0x0) {
    if (prefix != (char *)0x0) {
      memcpy(__dest,prefix,sVar1);
      __dest[sVar1 - 1] = '/';
    }
    memcpy(__dest + sVar1,path,sVar2 + 1);
    return __dest;
  }
  piVar3 = __errno_location();
  *piVar3 = 0xc;
  error("malloc()");
}

Assistant:

static char *
pathcat(const char *prefix, const char *path)
{
	char *str;
	size_t prelen, len;

	prelen = prefix ? strlen(prefix) + 1 : 0;
	len = strlen(path) + 1;
	if ((str = malloc(prelen + len)) == NULL) {
		errno = ENOMEM;
		error("malloc()");
	}
	if (prefix) {
		memcpy(str, prefix, prelen);	/* includes zero */
		str[prelen - 1] = '/';		/* splat zero */
	}
	memcpy(str + prelen, path, len);	/* includes zero */

	return (str);
}